

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O3

double getPSNR(TRIPLEBYTES **mrx1,TRIPLEBYTES **mrx2,int y,int x,int h,int w,int component)

{
  byte bVar1;
  byte bVar2;
  int j;
  int iVar3;
  double dVar4;
  
  dVar4 = 0.0;
  iVar3 = h - y;
  if (iVar3 != 0 && y <= h) {
    do {
      j = x;
      if (x < w) {
        do {
          bVar1 = getComponent(mrx1,y,j,component);
          bVar2 = getComponent(mrx2,y,j,component);
          dVar4 = dVar4 + (double)(int)((uint)bVar1 - (uint)bVar2) *
                          (double)(int)((uint)bVar1 - (uint)bVar2);
          j = j + 1;
        } while (w != j);
      }
      y = y + 1;
    } while (y != h);
  }
  dVar4 = log10(((double)((w - x) * iVar3) * 65025.0) / dVar4);
  return dVar4 * 10.0;
}

Assistant:

double getPSNR(TRIPLEBYTES **mrx1, TRIPLEBYTES **mrx2, int y, int x, int h, int w, int component) {
    double count = 0;
    for (int i = y; i < h; i++) {
        for (int j = x; j < w; j++) {
            count += pow(getComponent(mrx1, i, j, component) -
                         getComponent(mrx2, i, j, component), 2);
        }
    }
    return 10 * log10(((w - x) * (h - y) * pow(255, 2)) / count);
}